

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

int __thiscall
HashMap<Socket_*,_unsigned_int>::remove(HashMap<Socket_*,_unsigned_int> *this,char *__filename)

{
  uint uVar1;
  Iterator it;
  Item *local_10;
  
  local_10 = (Item *)find(this,(Socket **)__filename);
  if (local_10 != (this->_end).item) {
    uVar1 = remove(this,(char *)&local_10);
    local_10 = (Item *)(ulong)uVar1;
  }
  return (int)local_10;
}

Assistant:

void remove(const T& key)
  {
    Iterator it = find(key);
    if(it != _end)
      remove(it);
  }